

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkFormatArguments(CheckerVisitor *this,CallExpr *call)

{
  uint uVar1;
  undefined8 *puVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  int iVar5;
  Expr *pEVar6;
  SQChar *__s;
  char *pcVar7;
  _func_int **pp_Var8;
  size_type sVar9;
  int32_t i;
  ulong uVar10;
  undefined8 *puVar11;
  bool bVar12;
  allocator<char> local_51;
  string transformed;
  
  if (this->effectsOnly != false) {
    return;
  }
  uVar1 = (call->_args)._size;
  uVar10 = 0;
  while( true ) {
    if (uVar1 == uVar10) {
      return;
    }
    pEVar6 = deparen((call->_args)._vals[uVar10]);
    if (((pEVar6->super_Node)._op == TO_LITERAL) && (*(int *)&(pEVar6->super_Node).field_0x1c == 0))
    break;
    uVar10 = uVar10 + 1;
  }
  pp_Var8 = pEVar6[1].super_Node.super_ArenaObj._vptr_ArenaObj;
  uVar4 = 0;
  do {
    if (*(char *)pp_Var8 == '%') {
      bVar12 = *(char *)((long)pp_Var8 + 1) != '%';
      if (!bVar12) {
        pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
      }
      uVar4 = uVar4 + bVar12;
    }
    else if (*(char *)pp_Var8 == '\0') {
      if (((uVar4 != 0) && (~uVar4 + uVar1 != (int)uVar10)) &&
         (__s = extractFunctionName(this,call), __s != (SQChar *)0x0)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&transformed,__s,&local_51);
        _Var3 = transformed._M_dataplus;
        for (sVar9 = 0; puVar2 = DAT_0019f050,
            puVar11 = SQCompilationContext::format_function_name_abi_cxx11_,
            transformed._M_string_length != sVar9; sVar9 = sVar9 + 1) {
          iVar5 = tolower((int)_Var3._M_p[sVar9]);
          _Var3._M_p[sVar9] = (char)iVar5;
        }
        do {
          if (puVar11 == puVar2) {
            std::__cxx11::string::~string((string *)&transformed);
            return;
          }
          pcVar7 = strstr(transformed._M_dataplus._M_p,(char *)*puVar11);
          puVar11 = puVar11 + 4;
        } while (pcVar7 == (char *)0x0);
        std::__cxx11::string::~string((string *)&transformed);
        report(this,&(call->_args)._vals[uVar10]->super_Node,0x53);
      }
      return;
    }
    pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
  } while( true );
}

Assistant:

void CheckerVisitor::checkFormatArguments(const CallExpr *call) {
  if (effectsOnly)
    return;

  const auto &arguments = call->arguments();

  for (int32_t i = 0; i < arguments.size(); ++i) {
    const Expr *arg = deparen(arguments[i]);
    if (arg->op() == TO_LITERAL && arg->asLiteral()->kind() == LK_STRING) { // -V522
      int32_t formatsCount = 0;
      for (const SQChar *s = arg->asLiteral()->s(); *s; ++s) {
        if (*s == '%') {
          if (*(s + 1) == '%') {
            s++;
          }
          else {
            formatsCount++;
          }
        }
      }

      if (formatsCount && formatsCount != (arguments.size() - i - 1)) {
        const SQChar *name = extractFunctionName(call);
        if (!name)
          return;

        if (nameLooksLikeFormatFunction(name)) {
          report(arguments[i], DiagnosticsId::DI_FORMAT_ARGUMENTS_COUNT);
        }
      }

      return;
    }
  }
}